

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::usub_borrow_invalid_x
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  ShaderFunction xDataType;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  bool bVar1;
  char *__s;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  string shaderSource;
  ShaderFunction SVar5;
  undefined4 in_stack_ffffffffffffff0c;
  DataType in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  _Alloc_hider _Var6;
  size_type sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  allocator<char> local_c1;
  long local_c0;
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  _Var6._M_p = (pointer)&local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff18,"usubBorrow: Invalid x type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != &local_d8) {
    operator_delete(_Var6._M_p,local_d8._M_allocated_capacity + 1);
  }
  lVar4 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar4];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_c1);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1c82f43);
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar3) {
        local_d8._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_d8._8_8_ = plVar2[3];
        _Var6._M_p = (pointer)&local_d8;
      }
      else {
        local_d8._M_allocated_capacity = paVar3->_M_allocated_capacity;
        _Var6._M_p = (pointer)*plVar2;
      }
      sVar7 = plVar2[1];
      *plVar2 = (long)paVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_d8) {
        operator_delete(_Var6._M_p,local_d8._M_allocated_capacity + 1);
      }
      local_58 = lVar4;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar4 = 0;
      do {
        xDataType = deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes[lVar4];
        SVar5 = xDataType;
        local_c0 = lVar4;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceAddCarrySubBorrow_abi_cxx11_
                  ((string *)&stack0xffffffffffffff18,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_COMPUTE,
                   deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar4],
                   xDataType,xDataType,in_stack_ffffffffffffff10);
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char*>((string *)local_98,_Var6._M_p,_Var6._M_p + sVar7);
        shaderSource_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffff0c;
        shaderSource_00._M_dataplus._M_p._0_4_ = SVar5;
        shaderSource_00._M_string_length._0_4_ = in_stack_ffffffffffffff10;
        shaderSource_00._M_string_length._4_4_ = in_stack_ffffffffffffff14;
        shaderSource_00.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
        shaderSource_00.field_2._8_8_ = sVar7;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_98[0],shaderSource_00);
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_p != &local_d8) {
          operator_delete(_Var6._M_p,local_d8._M_allocated_capacity + 1);
        }
        SVar5 = xDataType;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceAddCarrySubBorrow_abi_cxx11_
                  ((string *)&stack0xffffffffffffff18,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_COMPUTE,
                   deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes[local_c0],
                   xDataType,xDataType,in_stack_ffffffffffffff10);
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char*>((string *)local_78,_Var6._M_p,_Var6._M_p + sVar7);
        shaderSource_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffff0c;
        shaderSource_01._M_dataplus._M_p._0_4_ = SVar5;
        shaderSource_01._M_string_length._0_4_ = in_stack_ffffffffffffff10;
        shaderSource_01._M_string_length._4_4_ = in_stack_ffffffffffffff14;
        shaderSource_01.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
        shaderSource_01.field_2._8_8_ = sVar7;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_78[0],shaderSource_01);
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_p != &local_d8) {
          operator_delete(_Var6._M_p,local_d8._M_allocated_capacity + 1);
        }
        lVar4 = 0;
        do {
          if (*(ShaderFunction *)
               ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes + lVar4) !=
              xDataType) {
            SVar5 = xDataType;
            NegativeTestShared::(anonymous_namespace)::genShaderSourceAddCarrySubBorrow_abi_cxx11_
                      ((string *)&stack0xffffffffffffff18,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_COMPUTE,
                       *(ShaderFunction *)
                        ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes +
                        lVar4),xDataType,xDataType,in_stack_ffffffffffffff10);
            local_b8[0] = local_a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b8,_Var6._M_p,_Var6._M_p + sVar7);
            shaderSource_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffff0c;
            shaderSource_02._M_dataplus._M_p._0_4_ = SVar5;
            shaderSource_02._M_string_length._0_4_ = in_stack_ffffffffffffff10;
            shaderSource_02._M_string_length._4_4_ = in_stack_ffffffffffffff14;
            shaderSource_02.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
            shaderSource_02.field_2._8_8_ = sVar7;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_b8[0],shaderSource_02);
            if (local_b8[0] != local_a8) {
              operator_delete(local_b8[0],local_a8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var6._M_p != &local_d8) {
              operator_delete(_Var6._M_p,local_d8._M_allocated_capacity + 1);
            }
          }
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0x10);
        lVar4 = local_c0 + 1;
      } while (lVar4 != 4);
      NegativeTestContext::endSection(ctx);
      lVar4 = local_58;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void usub_borrow_invalid_x (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));

	ctx.beginSection("usubBorrow: Invalid x type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourceAddCarrySubBorrow(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_USUB_BORROW, s_floatTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceAddCarrySubBorrow(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_USUB_BORROW, s_intTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx2)
				{
					if (s_uintTypes[dataTypeNdx2] == s_uintTypes[dataTypeNdx])
						continue;

					const std::string shaderSource(genShaderSourceAddCarrySubBorrow(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_USUB_BORROW, s_uintTypes[dataTypeNdx2], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}